

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

int doprring(void)

{
  char cVar1;
  bool bVar2;
  uint local_10;
  char local_b [3];
  int ct;
  char lets [3];
  
  if ((uleft == (obj *)0x0) && (uright == (obj *)0x0)) {
    pline("You are not wearing any rings.");
  }
  else {
    bVar2 = uleft != (obj *)0x0;
    if (bVar2) {
      local_b[0] = obj_to_let(uleft);
    }
    local_10 = (uint)bVar2;
    if (uright != (obj *)0x0) {
      cVar1 = obj_to_let(uright);
      local_b[(int)local_10] = cVar1;
      local_10 = local_10 + 1;
    }
    local_b[(int)local_10] = '\0';
    display_inventory(local_b,'\0');
  }
  return 0;
}

Assistant:

int doprring(void)
{
	if (!uleft && !uright)
		pline("You are not wearing any rings.");
	else {
		char lets[3];
		int ct = 0;

		if (uleft) lets[ct++] = obj_to_let(uleft);
		if (uright) lets[ct++] = obj_to_let(uright);
		lets[ct] = 0;
		display_inventory(lets, FALSE);
	}
	return 0;
}